

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

size_t strcspn(char *__s,char *__reject)

{
  char cVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  
  cVar3 = *__s;
  sVar2 = 0;
  do {
    pcVar4 = __reject;
    if (cVar3 == '\0') {
      return sVar2;
    }
    do {
      cVar1 = *pcVar4;
      if (cVar3 == cVar1) {
        return sVar2;
      }
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
    sVar2 = sVar2 + 1;
    cVar3 = __s[1];
    __s = __s + 1;
  } while( true );
}

Assistant:

size_t strcspn(const char *s1, const char *s2) {
    size_t res = 0;
    while (*s1 != '\0') {
        if (strchr(s2, *s1) == NULL) {
            ++s1;
            ++res;
        } else {
            return res;
        }
    }
    return res;
}